

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall minja::Value::operator+(Value *__return_storage_ptr__,Value *this,Value *rhs)

{
  value_t vVar1;
  value_t vVar2;
  element_type *peVar3;
  pointer pVVar4;
  long lVar5;
  long lVar6;
  Value *item_1;
  pointer pVVar7;
  Value *item;
  double dVar8;
  double dVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<minja::Value,_std::allocator<minja::Value>_> local_78;
  string local_60;
  string local_40;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if ((vVar1 == string) || (vVar2 = (rhs->primitive_).m_data.m_type, vVar2 == string)) {
    to_str_abi_cxx11_(&local_40,this);
    to_str_abi_cxx11_(&local_60,rhs);
    std::operator+(&local_98,&local_40,&local_60);
    Value(__return_storage_ptr__,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if ((byte)(vVar2 - number_integer | vVar1 - number_integer) < 2) {
    lVar5 = get<long>(this);
    lVar6 = get<long>(rhs);
    local_98._M_dataplus._M_p = (pointer)(lVar6 + lVar5);
    Value(__return_storage_ptr__,(int64_t *)&local_98);
  }
  else if (((this->array_).
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) ||
          ((rhs->array_).
           super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr == (element_type *)0x0)) {
    dVar8 = get<double>(this);
    dVar9 = get<double>(rhs);
    local_98._M_dataplus._M_p = (pointer)(dVar9 + dVar8);
    Value(__return_storage_ptr__,(double *)&local_98);
  }
  else {
    local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    array(__return_storage_ptr__,&local_78);
    std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_78);
    peVar3 = (this->array_).
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pVVar4 = (peVar3->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar7 = (peVar3->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
                  super__Vector_impl_data._M_start; pVVar7 != pVVar4; pVVar7 = pVVar7 + 1) {
      push_back(__return_storage_ptr__,pVVar7);
    }
    peVar3 = (rhs->array_).
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pVVar4 = (peVar3->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar7 = (peVar3->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
                  super__Vector_impl_data._M_start; pVVar7 != pVVar4; pVVar7 = pVVar7 + 1) {
      push_back(__return_storage_ptr__,pVVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value operator+(const Value& rhs) const {
      if (is_string() || rhs.is_string()) {
        return to_str() + rhs.to_str();
      } else if (is_number_integer() && rhs.is_number_integer()) {
        return get<int64_t>() + rhs.get<int64_t>();
      } else if (is_array() && rhs.is_array()) {
        auto res = Value::array();
        for (const auto& item : *array_) res.push_back(item);
        for (const auto& item : *rhs.array_) res.push_back(item);
        return res;
      } else {
        return get<double>() + rhs.get<double>();
      }
  }